

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

void __thiscall
Js::InlinedFrameWalker::FinalizeStackValues
          (InlinedFrameWalker *this,Var *args,size_t argCount,bool deepCopy)

{
  JavascriptFunction *this_00;
  ScriptContext *scriptContext_00;
  Var pvVar1;
  ulong local_38;
  size_t i;
  ScriptContext *scriptContext;
  bool deepCopy_local;
  size_t argCount_local;
  Var *args_local;
  InlinedFrameWalker *this_local;
  
  this_00 = GetFunctionObject(this);
  scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this_00);
  for (local_38 = 0; local_38 < argCount; local_38 = local_38 + 1) {
    pvVar1 = Js::JavascriptOperators::BoxStackInstance
                       (args[local_38],scriptContext_00,false,deepCopy);
    args[local_38] = pvVar1;
  }
  return;
}

Assistant:

void InlinedFrameWalker::FinalizeStackValues(__in_ecount(argCount) Js::Var args[], size_t argCount, bool deepCopy) const
    {
        ScriptContext *scriptContext = this->GetFunctionObject()->GetScriptContext();

        for (size_t i = 0; i < argCount; i++)
        {
            args[i] = Js::JavascriptOperators::BoxStackInstance(args[i], scriptContext, false /*allowStackFunction*/, deepCopy);
        }
    }